

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CColorConverter.cpp
# Opt level: O3

void irr::video::CColorConverter::convert_R8G8B8toB8G8R8(void *sP,s32 sN,void *dP)

{
  long lVar1;
  u8 *dB;
  u8 *sB;
  
  if (0 < sN) {
    lVar1 = 0;
    do {
      *(undefined1 *)((long)dP + lVar1 + 2) = *(undefined1 *)((long)sP + lVar1);
      *(undefined1 *)((long)dP + lVar1 + 1) = *(undefined1 *)((long)sP + lVar1 + 1);
      *(undefined1 *)((long)dP + lVar1) = *(undefined1 *)((long)sP + lVar1 + 2);
      lVar1 = lVar1 + 3;
      sN = sN + -1;
    } while (sN != 0);
  }
  return;
}

Assistant:

void CColorConverter::convert_R8G8B8toB8G8R8(const void *sP, s32 sN, void *dP)
{
	u8 *sB = (u8 *)sP;
	u8 *dB = (u8 *)dP;

	for (s32 x = 0; x < sN; ++x) {
		dB[2] = sB[0];
		dB[1] = sB[1];
		dB[0] = sB[2];

		sB += 3;
		dB += 3;
	}
}